

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O2

void initSearchPaths(void)

{
  char *pcVar1;
  istream *piVar2;
  size_type sVar3;
  string searchPaths;
  string item;
  stringstream ss;
  
  searchPaths._M_dataplus._M_p = (pointer)&searchPaths.field_2;
  searchPaths._M_string_length = 0;
  searchPaths.field_2._M_local_buf[0] = '\0';
  pcVar1 = getenv("DYLD_LIBRARY_PATH");
  if (pcVar1 == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    std::__cxx11::string::assign((char *)&searchPaths);
    sVar3 = searchPaths._M_string_length;
  }
  pcVar1 = getenv("DYLD_FALLBACK_FRAMEWORK_PATH");
  if (pcVar1 != (char *)0x0) {
    if ((sVar3 != 0) && (searchPaths._M_dataplus._M_p[sVar3 - 1] != ':')) {
      std::__cxx11::string::append((char *)&searchPaths);
    }
    std::__cxx11::string::append((char *)&searchPaths);
    sVar3 = searchPaths._M_string_length;
  }
  pcVar1 = getenv("DYLD_FALLBACK_LIBRARY_PATH");
  if (pcVar1 != (char *)0x0) {
    if ((sVar3 != 0) && (searchPaths._M_dataplus._M_p[sVar3 - 1] != ':')) {
      std::__cxx11::string::append((char *)&searchPaths);
    }
    std::__cxx11::string::append((char *)&searchPaths);
    sVar3 = searchPaths._M_string_length;
  }
  if (sVar3 != 0) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&ss,(string *)&searchPaths,_S_out|_S_in);
    item._M_dataplus._M_p = (pointer)&item.field_2;
    item._M_string_length = 0;
    item.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ss,(string *)&item,':');
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      if (item._M_dataplus._M_p[item._M_string_length - 1] != '/') {
        std::__cxx11::string::append((char *)&item);
      }
      Settings::addSearchPath(&item);
    }
    std::__cxx11::string::~string((string *)&item);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__cxx11::string::~string((string *)&searchPaths);
  return;
}

Assistant:

void Dependency::copyYourself()
{
    copyFile(getOriginalPath(), getInstallPath());
    
    // Fix the lib's inner name
    std::string command = std::string("install_name_tool -id \"") + getInnerPath() + "\" \"" + getInstallPath() + "\"";
    if( systemp( command ) != 0 )
    {
        std::cerr << "\n\nError : An error occured while trying to change identity of library " << getInstallPath() << std::endl;
        exit(1);
    }
}